

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

int QHostInfo::lookupHostImpl
              (QString *name,QObject *receiver,QSlotObjectBase *slotObjRaw,char *member)

{
  bool bVar1;
  int iVar2;
  QThread *pQVar3;
  long lVar4;
  Type *this;
  SlotObjUniquePtr *slotObj_00;
  long in_RCX;
  QHostInfoResult *in_RSI;
  QHostInfoRunnable *in_RDI;
  ConnectionType CVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QHostInfoRunnable *runnable;
  QHostInfoLookupManager *manager;
  int id;
  bool isUsingStringBasedSlot;
  QHostInfoResult result_1;
  QHostInfo info;
  bool valid;
  QHostInfoResult result;
  QHostInfo hostInfo;
  SlotObjUniquePtr slotObj;
  undefined4 in_stack_fffffffffffffe98;
  HostInfoError in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffea8;
  int id_00;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  QHostInfoResult *in_stack_fffffffffffffeb8;
  SlotObjUniquePtr *in_stack_fffffffffffffec0;
  QHostInfoResult *in_stack_fffffffffffffec8;
  QHostInfoCache *in_stack_fffffffffffffed0;
  QHostInfoResult *this_00;
  int iVar7;
  QString *in_stack_fffffffffffffed8;
  int local_e4;
  Connection local_e0 [2];
  Connection local_d0 [2];
  char local_c0 [55];
  byte local_89;
  Connection local_88 [2];
  char local_78 [64];
  undefined8 local_38;
  char local_30 [32];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  std::unique_ptr<QtPrivate::QSlotObjectBase,QtPrivate::QSlotObjectBase::Deleter>::
  unique_ptr<QtPrivate::QSlotObjectBase::Deleter,void>
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (pointer)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  bVar6 = in_RCX != 0;
  pQVar3 = (QThread *)QThread::currentThread();
  lVar4 = QAbstractEventDispatcher::instance(pQVar3);
  if (lVar4 == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QMessageLogger::warning(local_30,"QHostInfo::lookupHost() called with no event dispatcher");
    local_e4 = -1;
    iVar7 = local_e4;
  }
  else {
    qRegisterMetaType<QHostInfo>();
    id_00 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    iVar2 = nextId();
    bVar1 = QString::isEmpty((QString *)0x21c19f);
    CVar5 = (ConnectionType)in_RCX;
    iVar7 = iVar2;
    if (bVar1) {
      local_38 = 0xaaaaaaaaaaaaaaaa;
      QHostInfo((QHostInfo *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),id_00);
      setError((QHostInfo *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9c);
      QCoreApplication::translate(local_78 + 0x28,"QHostInfo","No host name given",0);
      setErrorString((QHostInfo *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      QString::~QString((QString *)0x21c225);
      memset(local_78,0,0x28);
      local_78[0] = -0x56;
      local_78[1] = -0x56;
      local_78[2] = -0x56;
      local_78[3] = -0x56;
      local_78[4] = -0x56;
      local_78[5] = -0x56;
      local_78[6] = -0x56;
      local_78[7] = -0x56;
      local_78[8] = -0x56;
      local_78[9] = -0x56;
      local_78[10] = -0x56;
      local_78[0xb] = -0x56;
      local_78[0xc] = -0x56;
      local_78[0xd] = -0x56;
      local_78[0xe] = -0x56;
      local_78[0xf] = -0x56;
      local_78[0x10] = -0x56;
      local_78[0x11] = -0x56;
      local_78[0x12] = -0x56;
      local_78[0x13] = -0x56;
      local_78[0x14] = -0x56;
      local_78[0x15] = -0x56;
      local_78[0x16] = -0x56;
      local_78[0x17] = -0x56;
      local_78[0x18] = -0x56;
      local_78[0x19] = -0x56;
      local_78[0x1a] = -0x56;
      local_78[0x1b] = -0x56;
      local_78[0x1c] = -0x56;
      local_78[0x1d] = -0x56;
      local_78[0x1e] = -0x56;
      local_78[0x1f] = -0x56;
      local_78[0x20] = -0x56;
      local_78[0x21] = -0x56;
      local_78[0x22] = -0x56;
      local_78[0x23] = -0x56;
      local_78[0x24] = -0x56;
      local_78[0x25] = -0x56;
      local_78[0x26] = -0x56;
      local_78[0x27] = -0x56;
      this_00 = in_RSI;
      std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::unique_ptr
                ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      QHostInfoResult::QHostInfoResult
                (this_00,&in_stack_fffffffffffffec8->super_QObject,in_stack_fffffffffffffec0);
      std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
                ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      if (bVar6) {
        QObject::connect((QObject *)local_88,local_78,(QObject *)"2resultsReady(QHostInfo)",
                         (char *)in_RSI,CVar5);
        QMetaObject::Connection::~Connection(local_88);
      }
      QHostInfoResult::postResultsReady
                (in_stack_fffffffffffffeb8,
                 (QHostInfo *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      QHostInfoResult::~QHostInfoResult
                ((QHostInfoResult *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      ~QHostInfo((QHostInfo *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    }
    else {
      this = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
             ::operator()((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
                           *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      if (this != (Type *)0x0) {
        bVar1 = QHostInfoCache::isEnabled((QHostInfoCache *)0x21c391);
        if (bVar1) {
          local_89 = 0;
          local_c0[0x28] = -0x56;
          local_c0[0x29] = -0x56;
          local_c0[0x2a] = -0x56;
          local_c0[0x2b] = -0x56;
          local_c0[0x2c] = -0x56;
          local_c0[0x2d] = -0x56;
          local_c0[0x2e] = -0x56;
          local_c0[0x2f] = -0x56;
          QHostInfoCache::get(in_stack_fffffffffffffed0,(QString *)in_stack_fffffffffffffec8,
                              (bool *)in_stack_fffffffffffffec0);
          if ((local_89 & 1) == 0) {
            bVar1 = false;
          }
          else {
            setLookupId((QHostInfo *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                        in_stack_fffffffffffffe9c);
            memset(local_c0,0,0x28);
            local_c0[0] = -0x56;
            local_c0[1] = -0x56;
            local_c0[2] = -0x56;
            local_c0[3] = -0x56;
            local_c0[4] = -0x56;
            local_c0[5] = -0x56;
            local_c0[6] = -0x56;
            local_c0[7] = -0x56;
            local_c0[8] = -0x56;
            local_c0[9] = -0x56;
            local_c0[10] = -0x56;
            local_c0[0xb] = -0x56;
            local_c0[0xc] = -0x56;
            local_c0[0xd] = -0x56;
            local_c0[0xe] = -0x56;
            local_c0[0xf] = -0x56;
            local_c0[0x10] = -0x56;
            local_c0[0x11] = -0x56;
            local_c0[0x12] = -0x56;
            local_c0[0x13] = -0x56;
            local_c0[0x14] = -0x56;
            local_c0[0x15] = -0x56;
            local_c0[0x16] = -0x56;
            local_c0[0x17] = -0x56;
            local_c0[0x18] = -0x56;
            local_c0[0x19] = -0x56;
            local_c0[0x1a] = -0x56;
            local_c0[0x1b] = -0x56;
            local_c0[0x1c] = -0x56;
            local_c0[0x1d] = -0x56;
            local_c0[0x1e] = -0x56;
            local_c0[0x1f] = -0x56;
            local_c0[0x20] = -0x56;
            local_c0[0x21] = -0x56;
            local_c0[0x22] = -0x56;
            local_c0[0x23] = -0x56;
            local_c0[0x24] = -0x56;
            local_c0[0x25] = -0x56;
            local_c0[0x26] = -0x56;
            local_c0[0x27] = -0x56;
            in_stack_fffffffffffffec8 = in_RSI;
            std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::
            unique_ptr((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                        *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       (unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                        *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
            QHostInfoResult::QHostInfoResult
                      ((QHostInfoResult *)in_stack_fffffffffffffed0,
                       &in_stack_fffffffffffffec8->super_QObject,in_stack_fffffffffffffec0);
            std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::
            ~unique_ptr((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                         *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
            if (bVar6) {
              QObject::connect((QObject *)local_d0,local_c0,(QObject *)"2resultsReady(QHostInfo)",
                               (char *)in_RSI,CVar5);
              QMetaObject::Connection::~Connection(local_d0);
            }
            QHostInfoResult::postResultsReady
                      (in_stack_fffffffffffffeb8,
                       (QHostInfo *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
            bVar1 = true;
            QHostInfoResult::~QHostInfoResult
                      ((QHostInfoResult *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
            local_e4 = iVar2;
          }
          ~QHostInfo((QHostInfo *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          iVar7 = local_e4;
          if (bVar1) goto LAB_0021c619;
        }
        iVar7 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
        slotObj_00 = (SlotObjUniquePtr *)operator_new(0x58);
        std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::unique_ptr
                  ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   (unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        QHostInfoRunnable::QHostInfoRunnable
                  ((QHostInfoRunnable *)this,in_stack_fffffffffffffed8,iVar7,
                   &in_stack_fffffffffffffec8->super_QObject,slotObj_00);
        std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::
        ~unique_ptr((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                    CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        if (bVar6) {
          QObject::connect((QObject *)local_e0,(char *)(slotObj_00 + 6),
                           (QObject *)"2resultsReady(QHostInfo)",(char *)in_RSI,CVar5);
          QMetaObject::Connection::~Connection(local_e0);
        }
        QHostInfoLookupManager::scheduleLookup
                  ((QHostInfoLookupManager *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_RDI);
        iVar7 = iVar2;
      }
    }
  }
LAB_0021c619:
  local_e4 = iVar7;
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_e4;
}

Assistant:

int QHostInfo::lookupHostImpl(const QString &name,
                              const QObject *receiver,
                              QtPrivate::QSlotObjectBase *slotObjRaw,
                              const char *member)
{
    QtPrivate::SlotObjUniquePtr slotObj{slotObjRaw};
#if defined QHOSTINFO_DEBUG
    qDebug("QHostInfo::lookupHostImpl(\"%s\", %p, %p, %s)",
           name.toLatin1().constData(), receiver, slotObj.get(), member ? member + 1 : 0);
#endif
    Q_ASSERT(!member != !slotObj); // one of these must be set, but not both
    Q_ASSERT(receiver || slotObj);
    Q_ASSERT(!member || receiver); // if member is set, also is receiver
    const bool isUsingStringBasedSlot = static_cast<bool>(member);

    if (!QAbstractEventDispatcher::instance(QThread::currentThread())) {
        qWarning("QHostInfo::lookupHost() called with no event dispatcher");
        return -1;
    }

    qRegisterMetaType<QHostInfo>();

    int id = nextId(); // generate unique ID

    if (Q_UNLIKELY(name.isEmpty())) {
        QHostInfo hostInfo(id);
        hostInfo.setError(QHostInfo::HostNotFound);
        hostInfo.setErrorString(QCoreApplication::translate("QHostInfo", "No host name given"));

        QHostInfoResult result(receiver, std::move(slotObj));
        if (isUsingStringBasedSlot) {
            QObject::connect(&result, SIGNAL(resultsReady(QHostInfo)),
                            receiver, member, Qt::QueuedConnection);
        }
        result.postResultsReady(hostInfo);

        return id;
    }

#ifdef Q_OS_WASM
    // Resolve the host name directly without using a thread or cache,
    // since Emscripten's host lookup is fast. Emscripten maintains an internal
    // mapping of hosts and addresses for the purposes of WebSocket socket
    // tunnelling, and does not perform an actual host lookup.
    QHostInfo hostInfo = QHostInfoAgent::lookup(name);
    hostInfo.setLookupId(id);

    QHostInfoResult result(receiver, std::move(slotObj));
    if (isUsingStringBasedSlot) {
        QObject::connect(&result, SIGNAL(resultsReady(QHostInfo)),
                        receiver, member, Qt::QueuedConnection);
    }
    result.postResultsReady(hostInfo);
#else
    QHostInfoLookupManager *manager = theHostInfoLookupManager();

    if (Q_LIKELY(manager)) {
        // the application is still alive
        if (manager->cache.isEnabled()) {
            // check cache first
            bool valid = false;
            QHostInfo info = manager->cache.get(name, &valid);
            if (valid) {
                info.setLookupId(id);
                QHostInfoResult result(receiver, std::move(slotObj));
                if (isUsingStringBasedSlot) {
                    QObject::connect(&result, SIGNAL(resultsReady(QHostInfo)),
                                    receiver, member, Qt::QueuedConnection);
                }
                result.postResultsReady(info);
                return id;
            }
        }

        // cache is not enabled or it was not in the cache, do normal lookup
        QHostInfoRunnable *runnable = new QHostInfoRunnable(name, id, receiver, std::move(slotObj));
        if (isUsingStringBasedSlot) {
            QObject::connect(&runnable->resultEmitter, SIGNAL(resultsReady(QHostInfo)),
                                receiver, member, Qt::QueuedConnection);
        }
        manager->scheduleLookup(runnable);
    }
#endif // Q_OS_WASM
    return id;
}